

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O0

void __thiscall
google::protobuf::anon_unknown_19::FieldValuePrinterWrapper::PrintMessageEnd
          (FieldValuePrinterWrapper *this,Message *message,int field_index,int field_count,
          bool single_line_mode,BaseTextGenerator *generator)

{
  pointer pFVar1;
  uint in_ECX;
  uint in_EDX;
  undefined8 in_RSI;
  byte in_R8B;
  string *in_stack_ffffffffffffffa8;
  BaseTextGenerator *in_stack_ffffffffffffffb0;
  string local_48 [47];
  byte local_19;
  uint local_18;
  uint local_14;
  undefined8 local_10;
  
  local_19 = in_R8B & 1;
  local_18 = in_ECX;
  local_14 = in_EDX;
  local_10 = in_RSI;
  pFVar1 = std::
           unique_ptr<const_google::protobuf::TextFormat::FieldValuePrinter,_std::default_delete<const_google::protobuf::TextFormat::FieldValuePrinter>_>
           ::operator->((unique_ptr<const_google::protobuf::TextFormat::FieldValuePrinter,_std::default_delete<const_google::protobuf::TextFormat::FieldValuePrinter>_>
                         *)0x456bcb);
  (*pFVar1->_vptr_FieldValuePrinter[0xe])
            (local_48,pFVar1,local_10,(ulong)local_14,(ulong)local_18,(ulong)(local_19 & 1));
  TextFormat::BaseTextGenerator::PrintString(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  std::__cxx11::string::~string(local_48);
  return;
}

Assistant:

void PrintMessageEnd(
      const Message& message, int field_index, int field_count,
      bool single_line_mode,
      TextFormat::BaseTextGenerator* generator) const override {
    generator->PrintString(delegate_->PrintMessageEnd(
        message, field_index, field_count, single_line_mode));
  }